

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

double ddCountMintermAux(DdNode *node,double max,DdHashTable *table)

{
  uint *puVar1;
  uint uVar2;
  DdManager *pDVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  ptrint fanout;
  int *piVar7;
  double dVar8;
  double dVar9;
  double value;
  
  piVar7 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar7 == 0x7fffffff) {
    value = 0.0;
    if ((background != node) && (value = max, zero == node)) {
      value = 0.0;
    }
  }
  else if ((piVar7[1] == 1) || (pDVar5 = cuddHashTableLookup1(table,node), pDVar5 == (DdNode *)0x0))
  {
    pDVar5 = *(DdNode **)(piVar7 + 6);
    pDVar6 = (DdNode *)((ulong)*(DdNode **)(piVar7 + 4) ^ 1);
    if (((ulong)node & 1) == 0) {
      pDVar6 = *(DdNode **)(piVar7 + 4);
    }
    dVar8 = ddCountMintermAux(pDVar6,max,table);
    if ((dVar8 != -1.0) || (value = -1.0, NAN(dVar8))) {
      pDVar6 = (DdNode *)((ulong)pDVar5 ^ 1);
      if (((ulong)node & 1) == 0) {
        pDVar6 = pDVar5;
      }
      dVar9 = ddCountMintermAux(pDVar6,max,table);
      value = -1.0;
      if ((dVar9 != -1.0) || (NAN(dVar9))) {
        value = dVar9 * 0.5 + dVar8 * 0.5;
        uVar2 = piVar7[1];
        if ((ulong)uVar2 != 1) {
          pDVar5 = cuddUniqueConst(table->manager,value);
          iVar4 = cuddHashTableInsert1(table,node,pDVar5,(ulong)uVar2 - 1);
          if (iVar4 == 0) {
            piVar7 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar7 = *piVar7 + 1;
            Cudd_RecursiveDeref(table->manager,pDVar5);
            value = -1.0;
          }
        }
      }
    }
  }
  else {
    value = (pDVar5->type).value;
    if (pDVar5->ref == 0) {
      pDVar3 = table->manager;
      puVar1 = &pDVar3->dead;
      *puVar1 = *puVar1 + 1;
      puVar1 = &(pDVar3->constants).dead;
      *puVar1 = *puVar1 + 1;
    }
  }
  return value;
}

Assistant:

static double
ddCountMintermAux(
  DdNode * node,
  double  max,
  DdHashTable * table)
{
    DdNode      *N, *Nt, *Ne;
    double      min, minT, minE;
    DdNode      *res;

    N = Cudd_Regular(node);

    if (cuddIsConstant(N)) {
        if (node == background || node == zero) {
            return(0.0);
        } else {
            return(max);
        }
    }
    if (N->ref != 1 && (res = cuddHashTableLookup1(table,node)) != NULL) {
        min = cuddV(res);
        if (res->ref == 0) {
            table->manager->dead++;
            table->manager->constants.dead++;
        }
        return(min);
    }

    Nt = cuddT(N); Ne = cuddE(N);
    if (Cudd_IsComplement(node)) {
        Nt = Cudd_Not(Nt); Ne = Cudd_Not(Ne);
    }

    minT = ddCountMintermAux(Nt,max,table);
    if (minT == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    minT *= 0.5;
    minE = ddCountMintermAux(Ne,max,table);
    if (minE == (double)CUDD_OUT_OF_MEM) return((double)CUDD_OUT_OF_MEM);
    minE *= 0.5;
    min = minT + minE;

    if (N->ref != 1) {
        ptrint fanout = (ptrint) N->ref;
        cuddSatDec(fanout);
        res = cuddUniqueConst(table->manager,min);
        if (!cuddHashTableInsert1(table,node,res,fanout)) {
            cuddRef(res); Cudd_RecursiveDeref(table->manager, res);
            return((double)CUDD_OUT_OF_MEM);
        }
    }

    return(min);

}